

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_renorme(opj_mqc_t *mqc)

{
  opj_mqc_t *in_RDI;
  
  do {
    in_RDI->a = in_RDI->a << 1;
    in_RDI->c = in_RDI->c << 1;
    in_RDI->ct = in_RDI->ct - 1;
    if (in_RDI->ct == 0) {
      mqc_byteout(in_RDI);
    }
  } while ((in_RDI->a & 0x8000) == 0);
  return;
}

Assistant:

static void mqc_renorme(opj_mqc_t *mqc) {
	do {
		mqc->a <<= 1;
		mqc->c <<= 1;
		mqc->ct--;
		if (mqc->ct == 0) {
			mqc_byteout(mqc);
		}
	} while ((mqc->a & 0x8000) == 0);
}